

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

void ma_context_enumerate_devices_sink_callback__pulse
               (ma_pa_context *pPulseContext,ma_pa_sink_info *pSinkInfo,wchar_t endOfList,
               void *pUserData)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  ma_device_info_conflict deviceInfo;
  char local_618 [256];
  char acStack_518 [256];
  undefined4 local_418;
  
  if (pUserData == (void *)0x0) {
    __assert_fail("pData != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                  ,0x44bc,
                  "void ma_context_enumerate_devices_sink_callback__pulse(ma_pa_context *, const ma_pa_sink_info *, int, void *)"
                 );
  }
  if ((endOfList == L'\0') && (*(int *)((long)pUserData + 0x18) == 0)) {
    memset(local_618,0,0x608);
    pcVar2 = pSinkInfo->name;
    if (pcVar2 != (char *)0x0) {
      lVar4 = 0;
      do {
        cVar1 = pcVar2[lVar4];
        if (cVar1 == '\0') goto LAB_001a9800;
        local_618[lVar4] = cVar1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0xff);
      lVar4 = 0xff;
LAB_001a9800:
      local_618[lVar4] = '\0';
    }
    pcVar2 = pSinkInfo->description;
    if (pcVar2 != (char *)0x0) {
      lVar4 = 0;
      do {
        cVar1 = pcVar2[lVar4];
        if (cVar1 == '\0') goto LAB_001a982d;
        acStack_518[lVar4] = cVar1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0xff);
      lVar4 = 0xff;
LAB_001a982d:
      acStack_518[lVar4] = '\0';
    }
    if (pSinkInfo->index == *(ma_uint32 *)((long)pUserData + 0x1c)) {
      local_418 = 1;
    }
    iVar3 = (**(code **)((long)pUserData + 8))
                      (*pUserData,1,local_618,*(undefined8 *)((long)pUserData + 0x10));
    *(uint *)((long)pUserData + 0x18) = (uint)(iVar3 == 0);
  }
  return;
}

Assistant:

static void ma_context_enumerate_devices_sink_callback__pulse(ma_pa_context* pPulseContext, const ma_pa_sink_info* pSinkInfo, int endOfList, void* pUserData)
{
    ma_context_enumerate_devices_callback_data__pulse* pData = (ma_context_enumerate_devices_callback_data__pulse*)pUserData;
    ma_device_info deviceInfo;

    MA_ASSERT(pData != NULL);

    if (endOfList || pData->isTerminated) {
        return;
    }

    MA_ZERO_OBJECT(&deviceInfo);

    /* The name from PulseAudio is the ID for miniaudio. */
    if (pSinkInfo->name != NULL) {
        ma_strncpy_s(deviceInfo.id.pulse, sizeof(deviceInfo.id.pulse), pSinkInfo->name, (size_t)-1);
    }

    /* The description from PulseAudio is the name for miniaudio. */
    if (pSinkInfo->description != NULL) {
        ma_strncpy_s(deviceInfo.name, sizeof(deviceInfo.name), pSinkInfo->description, (size_t)-1);
    }

    if (pSinkInfo->index == pData->defaultDeviceIndexPlayback) {
        deviceInfo.isDefault = MA_TRUE;
    }

    pData->isTerminated = !pData->callback(pData->pContext, ma_device_type_playback, &deviceInfo, pData->pUserData);

    (void)pPulseContext; /* Unused. */
}